

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

Template * __thiscall
ctemplate::TemplateCache::GetTemplate(TemplateCache *this,TemplateString *filename,Strip strip)

{
  int iVar1;
  mapped_type *pmVar2;
  Template *pTVar3;
  RefcountedTemplate *refcounted_tpl;
  WriterMutexLock ml;
  TemplateCacheKey cache_key;
  RefcountedTemplate *local_38;
  WriterMutexLock local_30;
  TemplateCacheKey local_28;
  
  local_28.first = TemplateString::GetGlobalId(filename);
  local_30.mu_ = this->mutex_;
  local_28.second = strip;
  if (((pthread_rwlock_t *)((long)local_30.mu_ + 0x38))->__size[0] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_30.mu_);
    if (iVar1 != 0) {
      abort();
    }
  }
  local_38 = GetTemplateLocked(this,filename,strip,&local_28);
  if (local_38 == (RefcountedTemplate *)0x0) {
    pTVar3 = (Template *)0x0;
  }
  else {
    RefcountedTemplate::IncRef(local_38);
    pmVar2 = std::__detail::
             _Map_base<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->get_template_calls_,&local_38);
    *pmVar2 = *pmVar2 + 1;
    pTVar3 = local_38->ptr_;
  }
  WriterMutexLock::~WriterMutexLock(&local_30);
  return pTVar3;
}

Assistant:

const Template *TemplateCache::GetTemplate(const TemplateString& filename,
                                           Strip strip) {
  // No need to have the cache-mutex acquired for this step
  TemplateCacheKey cache_key = TemplateCacheKey(filename.GetGlobalId(), strip);
  CachedTemplate retval;
  WriterMutexLock ml(mutex_);
  RefcountedTemplate* refcounted_tpl =
      GetTemplateLocked(filename, strip, cache_key);
  if (!refcounted_tpl)
    return NULL;

  refcounted_tpl->IncRef();   // DecRef() is in DoneWithGetTemplatePtrs()
  (*get_template_calls_)[refcounted_tpl]++;   // set up for DoneWith...()
  return refcounted_tpl->tpl();
}